

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.hpp
# Opt level: O2

void __thiscall test::test(test *this,char *functionName)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,functionName);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

test(const char *functionName)
    {
        std::cout << "-------------------------------------------------------------------" << std::endl;
        std::cout << functionName << std::endl;
        std::cout << "-------------------------------------------------------------------" << std::endl;
    }